

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.cpp
# Opt level: O0

void __thiscall
QItemSelectionModelPrivate::layoutChanged
          (QItemSelectionModelPrivate *this,QList<QPersistentModelIndex> *param_2,
          LayoutChangeHint hint)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  arrow_operator_result ppQVar4;
  int in_EDX;
  long in_RDI;
  QItemSelectionRange *this_00;
  long in_FS_OFFSET;
  bool bVar5;
  int right;
  int bottom;
  QModelIndex br;
  QModelIndex tl;
  QModelIndex *in_stack_fffffffffffffdc8;
  QItemSelectionRange *in_stack_fffffffffffffdd0;
  iterator in_stack_fffffffffffffde0;
  QModelIndex *bottomR;
  iterator in_stack_fffffffffffffde8;
  QModelIndex *topL;
  QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *in_stack_fffffffffffffe48;
  QList<QPersistentModelIndex> *in_stack_fffffffffffffe70;
  undefined1 local_a0 [24];
  undefined1 *local_88;
  undefined1 *puStack_80;
  QModelIndex *local_78;
  QModelIndex local_70;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar5 = false;
  if ((*(byte *)(in_RDI + 0x120) & 1) != 0) {
    iVar1 = *(int *)(in_RDI + 0x130);
    ppQVar4 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
              ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                            *)in_stack_fffffffffffffdd0);
    in_stack_fffffffffffffe48 = (QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)*ppQVar4;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&(in_stack_fffffffffffffde0.i)->first);
    iVar3 = (**(_func_int **)&(in_stack_fffffffffffffe48->d).d[8].super_QArrayData)
                      (in_stack_fffffffffffffe48,local_20);
    bVar5 = false;
    if (iVar1 == iVar3) {
      iVar1 = *(int *)(in_RDI + 0x134);
      ppQVar4 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                              *)in_stack_fffffffffffffdd0);
      pQVar2 = *ppQVar4;
      QPersistentModelIndex::operator_cast_to_QModelIndex(&(in_stack_fffffffffffffde0.i)->first);
      iVar3 = (*(pQVar2->super_QObject)._vptr_QObject[0xf])(pQVar2,local_38);
      bVar5 = iVar1 == iVar3;
    }
  }
  if (bVar5) {
    QList<QItemSelectionRange>::clear((QList<QItemSelectionRange> *)in_stack_fffffffffffffdd0);
    QList<QItemSelectionRange>::clear((QList<QItemSelectionRange> *)in_stack_fffffffffffffdd0);
    iVar1 = *(int *)(in_RDI + 0x134);
    iVar3 = *(int *)(in_RDI + 0x130);
    topL = (QModelIndex *)&DAT_aaaaaaaaaaaaaaaa;
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    this_00 = (QItemSelectionRange *)(in_RDI + 0x78);
    ppQVar4 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
              ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                            *)in_stack_fffffffffffffdd0);
    pQVar2 = *ppQVar4;
    bottomR = &local_70;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)bottomR);
    (*(pQVar2->super_QObject)._vptr_QObject[0xc])(&local_58,pQVar2,0,0,bottomR);
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_80 = &DAT_aaaaaaaaaaaaaaaa;
    local_78 = topL;
    ppQVar4 = QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
              ::operator->((QObjectCompatProperty<QItemSelectionModelPrivate,_QAbstractItemModel_*,_&QItemSelectionModelPrivate::_qt_property_model_offset,_&QItemSelectionModelPrivate::setModel,_&QItemSelectionModelPrivate::modelChanged,_nullptr>
                            *)in_stack_fffffffffffffdd0);
    pQVar2 = *ppQVar4;
    QPersistentModelIndex::operator_cast_to_QModelIndex((QPersistentModelIndex *)bottomR);
    (*(pQVar2->super_QObject)._vptr_QObject[0xc])
              (&local_88,pQVar2,(ulong)(iVar1 - 1),(ulong)(iVar3 - 1),local_a0);
    QItemSelectionRange::QItemSelectionRange(this_00,topL,bottomR);
    QList<QItemSelectionRange>::operator<<
              ((QList<QItemSelectionRange> *)in_stack_fffffffffffffdd0,
               (rvalue_ref)in_stack_fffffffffffffdc8);
    QItemSelectionRange::~QItemSelectionRange(in_stack_fffffffffffffdd0);
    QModelIndex::QModelIndex((QModelIndex *)0x829cc1);
    QPersistentModelIndex::operator=(&in_stack_fffffffffffffdd0->tl,in_stack_fffffffffffffdc8);
    *(undefined1 *)(in_RDI + 0x120) = 0;
  }
  else if ((((in_EDX == 1) ||
            (bVar5 = QList<QPersistentModelIndex>::isEmpty((QList<QPersistentModelIndex> *)0x829d39)
            , !bVar5)) ||
           (bVar5 = QList<QPersistentModelIndex>::isEmpty((QList<QPersistentModelIndex> *)0x829d53),
           !bVar5)) &&
          (((in_EDX != 1 ||
            (bVar5 = QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::isEmpty
                               ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x829d75),
            !bVar5)) ||
           (bVar5 = QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::isEmpty
                              ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)0x829d8f),
           !bVar5)))) {
    QList<QItemSelectionRange>::clear((QList<QItemSelectionRange> *)in_stack_fffffffffffffdd0);
    QList<QItemSelectionRange>::clear((QList<QItemSelectionRange> *)in_stack_fffffffffffffdd0);
    if (in_EDX == 1) {
      QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::begin
                ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)in_stack_fffffffffffffdd0
                );
      QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::end
                ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)in_stack_fffffffffffffdd0
                );
      std::stable_sort<QList<std::pair<QPersistentModelIndex,unsigned_int>>::iterator>
                (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::begin
                ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)in_stack_fffffffffffffdd0
                );
      QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::end
                ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)in_stack_fffffffffffffdd0
                );
      std::stable_sort<QList<std::pair<QPersistentModelIndex,unsigned_int>>::iterator>
                (in_stack_fffffffffffffde8,in_stack_fffffffffffffde0);
      mergeRowLengths(in_stack_fffffffffffffe48);
      QItemSelection::operator=
                ((QItemSelection *)in_stack_fffffffffffffdd0,
                 (QItemSelection *)in_stack_fffffffffffffdc8);
      QItemSelection::~QItemSelection((QItemSelection *)0x82a00e);
      mergeRowLengths(in_stack_fffffffffffffe48);
      QItemSelection::operator=
                ((QItemSelection *)in_stack_fffffffffffffdd0,
                 (QItemSelection *)in_stack_fffffffffffffdc8);
      QItemSelection::~QItemSelection((QItemSelection *)0x82a053);
      QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear
                ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)in_stack_fffffffffffffdd0
                );
      QList<std::pair<QPersistentModelIndex,_unsigned_int>_>::clear
                ((QList<std::pair<QPersistentModelIndex,_unsigned_int>_> *)in_stack_fffffffffffffdd0
                );
    }
    else {
      QList<QPersistentModelIndex>::begin((QList<QPersistentModelIndex> *)in_stack_fffffffffffffdd0)
      ;
      QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)in_stack_fffffffffffffdd0);
      std::
      stable_sort<QList<QPersistentModelIndex>::iterator,bool(*)(QPersistentModelIndex_const&,QPersistentModelIndex_const&)>
                ((iterator)in_stack_fffffffffffffde8.i,(iterator)in_stack_fffffffffffffde0.i,
                 (_func_bool_QPersistentModelIndex_ptr_QPersistentModelIndex_ptr *)
                 in_stack_fffffffffffffdc8);
      QList<QPersistentModelIndex>::begin((QList<QPersistentModelIndex> *)in_stack_fffffffffffffdd0)
      ;
      QList<QPersistentModelIndex>::end((QList<QPersistentModelIndex> *)in_stack_fffffffffffffdd0);
      std::
      stable_sort<QList<QPersistentModelIndex>::iterator,bool(*)(QPersistentModelIndex_const&,QPersistentModelIndex_const&)>
                ((iterator)in_stack_fffffffffffffde8.i,(iterator)in_stack_fffffffffffffde0.i,
                 (_func_bool_QPersistentModelIndex_ptr_QPersistentModelIndex_ptr *)
                 in_stack_fffffffffffffdc8);
      mergeIndexes(in_stack_fffffffffffffe70);
      QItemSelection::operator=
                ((QItemSelection *)in_stack_fffffffffffffdd0,
                 (QItemSelection *)in_stack_fffffffffffffdc8);
      QItemSelection::~QItemSelection((QItemSelection *)0x829ebd);
      mergeIndexes(in_stack_fffffffffffffe70);
      QItemSelection::operator=
                ((QItemSelection *)in_stack_fffffffffffffdd0,
                 (QItemSelection *)in_stack_fffffffffffffdc8);
      QItemSelection::~QItemSelection((QItemSelection *)0x829f02);
      QList<QPersistentModelIndex>::clear((QList<QPersistentModelIndex> *)in_stack_fffffffffffffdd0)
      ;
      QList<QPersistentModelIndex>::clear((QList<QPersistentModelIndex> *)in_stack_fffffffffffffdd0)
      ;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QItemSelectionModelPrivate::layoutChanged(const QList<QPersistentModelIndex> &, QAbstractItemModel::LayoutChangeHint hint)
{
    // special case for when all indexes are selected
    if (tableSelected && tableColCount == model->columnCount(tableParent)
        && tableRowCount == model->rowCount(tableParent)) {
        ranges.clear();
        currentSelection.clear();
        int bottom = tableRowCount - 1;
        int right = tableColCount - 1;
        QModelIndex tl = model->index(0, 0, tableParent);
        QModelIndex br = model->index(bottom, right, tableParent);
        currentSelection << QItemSelectionRange(tl, br);
        tableParent = QModelIndex();
        tableSelected = false;
        return;
    }

    if ((hint != QAbstractItemModel::VerticalSortHint && savedPersistentCurrentIndexes.isEmpty() && savedPersistentIndexes.isEmpty())
     || (hint == QAbstractItemModel::VerticalSortHint && savedPersistentRowLengths.isEmpty() && savedPersistentCurrentRowLengths.isEmpty())) {
        // either the selection was actually empty, or we
        // didn't get the layoutAboutToBeChanged() signal
        return;
    }

    // clear the "old" selection
    ranges.clear();
    currentSelection.clear();

    if (hint != QAbstractItemModel::VerticalSortHint) {
        // sort the "new" selection, as preparation for merging
        std::stable_sort(savedPersistentIndexes.begin(), savedPersistentIndexes.end(),
                         qt_PersistentModelIndexLessThan);
        std::stable_sort(savedPersistentCurrentIndexes.begin(), savedPersistentCurrentIndexes.end(),
                         qt_PersistentModelIndexLessThan);

        // update the selection by merging the individual indexes
        ranges = mergeIndexes(savedPersistentIndexes);
        currentSelection = mergeIndexes(savedPersistentCurrentIndexes);

        // release the persistent indexes
        savedPersistentIndexes.clear();
        savedPersistentCurrentIndexes.clear();
    } else {
        // sort the "new" selection, as preparation for merging
        std::stable_sort(savedPersistentRowLengths.begin(), savedPersistentRowLengths.end());
        std::stable_sort(savedPersistentCurrentRowLengths.begin(), savedPersistentCurrentRowLengths.end());

        // update the selection by merging the individual indexes
        ranges = mergeRowLengths(savedPersistentRowLengths);
        currentSelection = mergeRowLengths(savedPersistentCurrentRowLengths);

        // release the persistent indexes
        savedPersistentRowLengths.clear();
        savedPersistentCurrentRowLengths.clear();
    }
}